

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType::~IfcBuildingElementProxyType
          (IfcBuildingElementProxyType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x8adfa0;
  *(undefined8 *)&this->field_0x30 = 0x8ae0b8;
  *(undefined8 *)&this[-1].field_0xd0 = 0x8adfc8;
  *(undefined8 *)&this[-1].field_0xe0 = 0x8adff0;
  *(undefined8 *)&this[-1].field_0x138 = 0x8ae018;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x8ae040;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x8ae068;
  *(undefined8 *)this = 0x8ae090;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x8ae380;
  *(undefined8 *)&this->field_0x30 = 0x8ae448;
  *(undefined8 *)&this[-1].field_0xd0 = 0x8ae3a8;
  *(undefined8 *)&this[-1].field_0xe0 = 0x8ae3d0;
  *(undefined8 *)&this[-1].field_0x138 = 0x8ae3f8;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x8ae420;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>.
             field_0x10;
  if (puVar1 != &this[-1].
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>.
                 field_0x20) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__008ae0e0);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcBuildingElementProxyType() : Object("IfcBuildingElementProxyType") {}